

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narrow.h
# Opt level: O3

int lf::base::narrow<int,unsigned_int>(uint from)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (-1 < (int)from) {
    return from;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Narrowing error.",0x10);
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,
             "static_cast<FROM>(to) == from && (std::is_signed_v<FROM> == std::is_signed_v<TO> || ((to < TO{}) == (from < FROM{})))"
             ,"");
  paVar2 = &local_200.field_2;
  local_200._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/narrow.h"
             ,"");
  std::__cxx11::stringbuf::str();
  AssertionFailed(&local_1e0,&local_200,0x26,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
  local_200._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/narrow.h"
             ,"");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  AssertionFailed(&local_1e0,&local_200,0x26,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  abort();
}

Assistant:

auto narrow(FROM from) noexcept -> TO {
  static_assert(std::is_arithmetic_v<TO>, "TO must be an arithmetic type");
  const TO to = static_cast<TO>(std::forward<FROM>(from));
  if constexpr (std::is_arithmetic_v<TO>) {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from &&
                      (std::is_signed_v<FROM> == std::is_signed_v<TO> ||
                       ((to < TO{}) == (from < FROM{}))),
                  "Narrowing error.");
  } else {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from, "Narrowing error.");
  }
  return to;
}